

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QAdoptedThread::QAdoptedThread(QAdoptedThread *this,QThreadData *data)

{
  AtomicType AVar1;
  QObjectData *pQVar2;
  QThreadPrivate *this_00;
  QBindingStatus *status;
  QThreadPrivate *pQVar3;
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *local_30;
  QObject *local_28;
  Data *local_20;
  
  pQVar3 = (QThreadPrivate *)&stack0xffffffffffffffc8;
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPrivate *)operator_new(0xd0);
  QThreadPrivate::QThreadPrivate(this_00,data);
  QObject::QObject((QObject *)this,(QObjectPrivate *)this_00,(QObject *)0x0);
  (this->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_006ad500;
  (this->super_QThread).super_QObject.d_ptr.d[2].q_ptr[5]._vptr_QObject = (_func_int **)this;
  (this->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_006ad458;
  QThreadData::deref(data);
  data->isAdopted = true;
  AVar1._M_b._M_p = (__base_type)((__base_type *)(in_FS_OFFSET + 0x10))->_M_p;
  (data->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p =
       (__pointer_type)AVar1._M_b._M_p;
  if (QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p == (__base_type)0x0) {
    local_38 = (QArrayData *)0x0;
    local_30 = L"Qt mainThread";
    local_28 = (QObject *)0xd;
    QCoreApplicationPrivate::theMainThread._q_value._M_b._M_p = (AtomicType)(AtomicType)this;
    QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p =
         (AtomicType)(AtomicType)AVar1._M_b._M_p;
    QObjectPrivate::setObjectNameWithoutBindings
              ((QObjectPrivate *)(this->super_QThread).super_QObject.d_ptr.d,
               (QString *)&stack0xffffffffffffffc8);
    this_00 = pQVar3;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        this_00 = (QThreadPrivate *)0x2;
        QArrayData::deallocate(local_38,2,0x10);
      }
    }
  }
  *(undefined1 *)
   &(this->super_QThread).super_QObject.d_ptr.d[1].postedEvents.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 1;
  init(this,(EVP_PKEY_CTX *)this_00);
  pQVar2 = (this->super_QThread).super_QObject.d_ptr.d;
  status = QtPrivate::getBindingStatus();
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)&pQVar2[2].parent,status);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAdoptedThread::QAdoptedThread(QThreadData *data)
    : QThread(*new QThreadPrivate(data))
{
    // avoid a cyclic reference count: QThreadData owns this QAdoptedThread
    // object but QObject's constructor increased the count
    data->deref();

    data->isAdopted = true;
    Qt::HANDLE id = QThread::currentThreadId();
    data->threadId.storeRelaxed(id);
    if (!QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        // we are the main thread
        QCoreApplicationPrivate::theMainThread.storeRelease(this);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(id);

        // bypass the bindings because nothing can be listening yet
        d_func()->setObjectNameWithoutBindings(u"Qt mainThread"_s);
    }

    // thread should be running and not finished for the lifetime
    // of the application (even if QCoreApplication goes away)
#if QT_CONFIG(thread)
    d_func()->threadState = QThreadPrivate::Running;
    init();
    d_func()->m_statusOrPendingObjects.setStatusAndClearList(
                QtPrivate::getBindingStatus({}));
#endif
    // fprintf(stderr, "new QAdoptedThread = %p\n", this);
}